

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O2

void __thiscall
ear::PolarExtent::PolarExtent
          (PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_,
          unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *core_impl_)

{
  double *pdVar1;
  double elevation;
  element_type *peVar2;
  int iVar3;
  Scalar *pSVar4;
  reference_type src;
  undefined4 extraout_var;
  extent_float_t *peVar5;
  Scalar *pSVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  size_t p;
  size_t n;
  shared_ptr<ear::PointSourcePanner> *this_00;
  size_t p_1;
  ulong uVar10;
  int i;
  long lVar11;
  long row;
  double dVar12;
  MatrixXd panning_positions;
  MatrixXd panning_results;
  VectorXd azimuths;
  anon_class_8_1_8991fb9c malloc_float;
  variable_if_dynamic<long,__1> local_110;
  double *local_f0;
  VectorXd elevations;
  Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
  local_80;
  Scalar local_48 [3];
  
  (this->core_impl)._M_t.
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl =
       (core_impl_->_M_t).
       super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
       super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
       super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl;
  (core_impl_->_M_t).
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl = (PolarExtentCore *)0x0;
  this_00 = &this->psp;
  std::__shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&this_00->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>,
             &psp_->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>);
  malloc_float.this._0_4_ =
       (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->pvsMin,(int *)&malloc_float);
  iVar3 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_PointSourcePanner[1])();
  malloc_float.this._0_4_ = iVar3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->pvsMax,(int *)&malloc_float);
  local_80.
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
  .m_data = (PointerType)0xc056800000000000;
  azimuths.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x4056800000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            ((RandomAccessLinSpacedReturnType *)&malloc_float,0x25,(Scalar *)&local_80,
             (Scalar *)&azimuths);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&elevations,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&malloc_float);
  malloc_float.this = malloc_float.this & 0xffffffff00000000;
  local_80.
  super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
  .m_data = (PointerType)
            CONCAT44(local_80.
                     super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
                     .m_data._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&panning_positions,(int *)&malloc_float,
             (int *)&local_80);
  pdVar8 = (double *)
           CONCAT44(elevations.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data._4_4_,
                    (int)elevations.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data);
  pdVar1 = pdVar8 + elevations.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
  for (; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    elevation = *pdVar8;
    dVar12 = cos(elevation * 0.017453292519943295);
    dVar12 = (dVar12 * 6.283185307179586) / 6.283185307179586;
    dVar12 = round((dVar12 + dVar12) * 36.0);
    local_80.
    super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
    .m_data = (PointerType)0x0;
    local_48[0] = 360.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
              ((RandomAccessLinSpacedReturnType *)&malloc_float,
               (long)(int)((int)dVar12 + 1 + (uint)((int)dVar12 == 0)),(Scalar *)&local_80,local_48)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&azimuths,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&malloc_float);
    for (lVar11 = 0;
        lVar11 < azimuths.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + -1; lVar11 = lVar11 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&azimuths,
                          lVar11);
      dVar12 = *pSVar4;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
                (&panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 ,panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows + 1,NoChange);
      cart((Vector3d *)&local_80,dVar12,elevation,1.0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&malloc_float,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 &panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 ,panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows + -1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&malloc_float,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_80);
    }
    free(azimuths.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free((void *)CONCAT44(elevations.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._4_4_,
                        (int)elevations.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data));
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&malloc_float
             ,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&panning_positions,(type *)0x0
            );
  elevations.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ =
       (*((this_00->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&panning_results,(int *)&elevations,(long *)&local_80);
  for (lVar11 = 0; lVar11 < local_110.m_value; lVar11 = lVar11 + 1) {
    peVar2 = (this_00->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    Eigen::
    Block<const_Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>
    ::Block(&local_80,
            (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
            &malloc_float,lVar11);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const,1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_48,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
                *)&local_80);
    (**peVar2->_vptr_PointSourcePanner)
              ((optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&azimuths,peVar2,
               (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_48);
    src = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                    ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&azimuths);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&elevations,
               &panning_results,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&elevations,src);
    boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
              ((optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&azimuths);
  }
  free(local_f0);
  iVar3 = (*((this->core_impl)._M_t.
             super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
             ._M_t.
             super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
             .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
            _vptr_PolarExtentCore[3])();
  uVar10 = CONCAT44(extraout_var,iVar3);
  (this->ctx).real_num_speakers =
       panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows;
  uVar9 = (uVar10 + panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_storage.m_rows) - 1;
  (this->ctx).num_speakers = uVar9 - uVar9 % uVar10;
  uVar9 = (panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols + uVar10) - 1;
  n = uVar9 - uVar9 % uVar10;
  (this->ctx).num_points = n;
  malloc_float.this = this;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()(&malloc_float,n);
  (this->ctx).xs = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()(&malloc_float,(this->ctx).num_points);
  (this->ctx).ys = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()(&malloc_float,(this->ctx).num_points);
  (this->ctx).zs = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     (&malloc_float,(this->ctx).num_speakers * (this->ctx).num_points);
  (this->ctx).panning_results = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     (&malloc_float,((this->ctx).num_points / uVar10) * (this->ctx).num_speakers);
  (this->ctx).summed_panning_results = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()(&malloc_float,(this->ctx).num_speakers);
  lVar11 = panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols + -1;
  (this->ctx).results = peVar5;
  for (uVar9 = 0;
      uVar9 != panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols; uVar9 = uVar9 + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,uVar9,0);
    (this->ctx).xs[uVar9] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,uVar9,1);
    (this->ctx).ys[uVar9] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,uVar9,2);
    (this->ctx).zs[uVar9] = (float)*pSVar6;
    for (row = 0; panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows != row; row = row + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &panning_results,row,uVar9);
      (this->ctx).panning_results[(this->ctx).num_points * row + uVar9] = (float)*pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &panning_results,row,uVar9);
      lVar7 = (uVar9 / uVar10) * (this->ctx).num_speakers;
      peVar5 = (this->ctx).summed_panning_results;
      peVar5[lVar7 + row] = (float)*pSVar6 + peVar5[lVar7 + row];
    }
  }
  for (uVar10 = panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols; uVar10 < (this->ctx).num_points; uVar10 = uVar10 + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,lVar11,0);
    (this->ctx).xs[uVar10] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,lVar11,1);
    (this->ctx).ys[uVar10] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_positions,lVar11,2);
    (this->ctx).zs[uVar10] = (float)*pSVar6;
  }
  free(panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_,
                           std::unique_ptr<PolarExtentCore> core_impl_)
      : core_impl(std::move(core_impl_)),
        psp(psp_),
        pvsMin(psp->numberOfOutputChannels()),
        pvsMax(psp->numberOfOutputChannels()) {
    auto panning_positions = generatePanningPositionsEven(nRows);
    auto panning_results =
        generatePanningPositionsResults(psp, panning_positions);

    size_t num_speakers = panning_results.rows();
    size_t num_points = panning_results.cols();
    size_t batch_size = core_impl->batch_size();
    ctx.real_num_speakers = num_speakers;
    ctx.num_speakers = round_up(num_speakers, batch_size);
    ctx.num_points = round_up(num_points, batch_size);

    // use regular malloc and free for memory management. reasoning:
    // - the parts compiled with different architectures should not use any
    //   in-line functions which could get merged; therefore using any kind of
    //   smart pointer in the interface is a bad plan
    // - we could use a smart pointer and extract a float pointer, but that
    //   doesn't make it much cleaner, would still break copying, and would
    //   ultimately be more code
    // - using smart pointers would be awkward anyway, as the alignment is
    //   known at run-time
    auto malloc_float = [&](size_t n) {
      auto mem = (extent_float_t *)xsimd::aligned_malloc(
          sizeof(extent_float_t) * n, core_impl->alignment());
      for (size_t i = 0; i < n; i++) mem[i] = 0.0;
      return mem;
    };

    ctx.xs = malloc_float(ctx.num_points);
    ctx.ys = malloc_float(ctx.num_points);
    ctx.zs = malloc_float(ctx.num_points);

    ctx.panning_results = malloc_float(ctx.num_points * ctx.num_speakers);
    size_t num_batches = ctx.num_points / batch_size;
    ctx.summed_panning_results = malloc_float(num_batches * ctx.num_speakers);

    ctx.results = malloc_float(ctx.num_speakers);

    for (size_t p = 0; p < num_points; p++) {
      ctx.xs[p] = static_cast<extent_float_t>(panning_positions(p, 0));
      ctx.ys[p] = static_cast<extent_float_t>(panning_positions(p, 1));
      ctx.zs[p] = static_cast<extent_float_t>(panning_positions(p, 2));

      for (size_t s = 0; s < num_speakers; s++) {
        ctx.panning_results[s * ctx.num_points + p] =
            static_cast<extent_float_t>(panning_results(s, p));
        size_t batch = p / batch_size;
        ctx.summed_panning_results[batch * ctx.num_speakers + s] +=
            static_cast<extent_float_t>(panning_results(s, p));
      }
    }

    for (size_t p = num_points; p < ctx.num_points; p++) {
      // the results of these will be ignored; make them consistent with the
      // rest of the batch
      ctx.xs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 0));
      ctx.ys[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 1));
      ctx.zs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 2));
    }
  }